

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_settings.cpp
# Opt level: O1

shared_ptr<const_TestSettings> parse_settings(int param_1,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  int iVar3;
  logic_error *this;
  long *plVar4;
  TestSettings *pTVar5;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_0000003c;
  element_type *peVar6;
  char *i_option;
  shared_ptr<const_TestSettings> sVar7;
  int integer;
  TestSettings results;
  int local_bc;
  TestSettings *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  TestSettings local_78;
  
  peVar6 = (element_type *)CONCAT44(in_register_0000003c,param_1);
  local_78.m_rand_seed = 0;
  local_78.m_exceptions = true;
  local_78.m_spare_one_cpu = false;
  local_78.m_test_allocators = true;
  local_78.m_print_progress = true;
  local_78.m_queue_tests_cardinality = 2000;
  local_78.m_allocator_stress_test = true;
  local_78.m_run_only.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_run_only.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_run_only.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.m_exclude.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_exclude.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_exclude.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc = 0;
  if ((*in_RDX != 0) && (in_RDX[1] != 0)) {
    plVar4 = in_RDX + 1;
    i_option = (char *)*plVar4;
    if (i_option != (char *)0x0) {
      do {
        bVar2 = anon_unknown.dwarf_14e47fe::append_string_list
                          (i_option,"-only:",&local_78.m_run_only);
        if (((!bVar2) &&
            (bVar2 = anon_unknown.dwarf_14e47fe::append_string_list
                               ((char *)*plVar4,"-exclude:",&local_78.m_exclude), !bVar2)) &&
           (iVar3 = __isoc99_sscanf(*plVar4,"-rand_seed:%u",&local_78), iVar3 != 1)) {
          iVar3 = __isoc99_sscanf(*plVar4,"-exceptions:%d",&local_bc);
          if (iVar3 == 1) {
            local_78.m_exceptions = local_bc != 0;
          }
          else {
            iVar3 = __isoc99_sscanf(*plVar4,"-spare_one_cpu:%d",&local_bc);
            if (iVar3 == 1) {
              local_78.m_spare_one_cpu = local_bc != 0;
            }
            else {
              iVar3 = __isoc99_sscanf(*plVar4,"-print_progress:%d",&local_bc);
              if (iVar3 == 1) {
                local_78.m_print_progress = local_bc != 0;
              }
              else {
                iVar3 = __isoc99_sscanf(*plVar4,"-test_allocators:%d",&local_bc);
                if (iVar3 == 1) {
                  local_78.m_test_allocators = local_bc != 0;
                }
                else {
                  iVar3 = __isoc99_sscanf(*plVar4,"-queue_tests_cardinality:%zu",
                                          &local_78.m_queue_tests_cardinality);
                  if (iVar3 != 1) {
                    this = (logic_error *)__cxa_allocate_exception(0x10);
                    local_a8._16_8_ = local_88;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(local_a8 + 0x10),"Unrecognized commandline: ","");
                    plVar4 = (long *)std::__cxx11::string::append(local_a8 + 0x10);
                    local_b8 = (TestSettings *)*plVar4;
                    pTVar5 = (TestSettings *)(plVar4 + 2);
                    if (local_b8 == pTVar5) {
                      local_a8._0_4_ = pTVar5->m_rand_seed;
                      local_a8[4] = pTVar5->m_exceptions;
                      local_a8[5] = pTVar5->m_spare_one_cpu;
                      local_a8[6] = pTVar5->m_test_allocators;
                      local_a8[7] = pTVar5->m_print_progress;
                      local_a8._8_8_ = plVar4[3];
                      local_b8 = (TestSettings *)local_a8;
                    }
                    else {
                      local_a8._0_4_ = pTVar5->m_rand_seed;
                      local_a8[4] = pTVar5->m_exceptions;
                      local_a8[5] = pTVar5->m_spare_one_cpu;
                      local_a8[6] = pTVar5->m_test_allocators;
                      local_a8[7] = pTVar5->m_print_progress;
                    }
                    local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
                    *plVar4 = (long)pTVar5;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    std::logic_error::logic_error(this,(string *)&local_b8);
                    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                }
              }
            }
          }
        }
        i_option = (char *)plVar4[1];
        plVar4 = plVar4 + 1;
      } while (i_option != (char *)0x0);
    }
  }
  local_b8 = (TestSettings *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestSettings,std::allocator<TestSettings>,TestSettings&>
            (&local_b0,&local_b8,(allocator<TestSettings> *)(local_a8 + 0x10),&local_78);
  _Var1._M_pi = local_b0._M_pi;
  *(TestSettings **)peVar6 = local_b8;
  peVar6->m_queue_tests_cardinality = 0;
  local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar6->m_queue_tests_cardinality = (size_t)_Var1._M_pi;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78.m_exclude);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78.m_run_only);
  sVar7.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar7.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  return (shared_ptr<const_TestSettings>)
         sVar7.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const TestSettings> parse_settings(int /*argc*/, char ** argv)
{
    TestSettings results;

    int integer = 0;

    if (*argv != nullptr && *++argv != nullptr)
    {
        for (auto parameter = argv; *parameter != nullptr; parameter++)
        {
            if (append_string_list(*parameter, "-only:", results.m_run_only))
            {
            }
            else if (append_string_list(*parameter, "-exclude:", results.m_exclude))
            {
            }
            else if (sscanf(*parameter, "-rand_seed:%" SCNu32, &results.m_rand_seed) == 1)
            {
            }
            else if (sscanf(*parameter, "-exceptions:%d", &integer) == 1)
            {
                results.m_exceptions = integer != 0;
            }
            else if (sscanf(*parameter, "-spare_one_cpu:%d", &integer) == 1)
            {
                results.m_spare_one_cpu = integer != 0;
            }
            else if (sscanf(*parameter, "-print_progress:%d", &integer) == 1)
            {
                results.m_print_progress = integer != 0;
            }
            else if (sscanf(*parameter, "-test_allocators:%d", &integer) == 1)
            {
                results.m_test_allocators = integer != 0;
            }
            else if (
              sscanf(
                *parameter, "-queue_tests_cardinality:%zu", &results.m_queue_tests_cardinality) ==
              1)
            {
            }
            else
            {
                throw std::logic_error(std::string("Unrecognized commandline: ") + *parameter);
            }
        }
    }
    return std::make_shared<TestSettings>(results);
}